

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O0

Result __thiscall
wabt::BinaryReaderLogging::OnFuncType
          (BinaryReaderLogging *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  Enum EVar1;
  Type *result_types_local;
  Index result_count_local;
  Type *param_types_local;
  Index param_count_local;
  Index index_local;
  BinaryReaderLogging *this_local;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnFuncType(index: %u, params: ",(ulong)index);
  LogTypes(this,param_count,param_types);
  Stream::Writef(this->stream_,", results: ");
  LogTypes(this,result_count,result_types);
  Stream::Writef(this->stream_,")\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0xb])
                    (this->reader_,(ulong)index,(ulong)param_count,param_types,(ulong)result_count,
                     result_types);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  LOGF("OnFuncType(index: %" PRIindex ", params: ", index);
  LogTypes(param_count, param_types);
  LOGF_NOINDENT(", results: ");
  LogTypes(result_count, result_types);
  LOGF_NOINDENT(")\n");
  return reader_->OnFuncType(index, param_count, param_types, result_count,
                             result_types);
}